

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecx_kmgmt.c
# Opt level: O0

int ecx_set_params(void *key,OSSL_PARAM *params)

{
  int iVar1;
  OSSL_PARAM *pOVar2;
  long in_RSI;
  OSSL_PARAM *in_RDI;
  void *buf;
  OSSL_PARAM *p;
  ECX_KEY *ecxkey;
  undefined4 in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  OSSL_PARAM *in_stack_ffffffffffffffd0;
  int local_4;
  
  if (in_RSI == 0) {
    local_4 = 1;
  }
  else {
    pOVar2 = OSSL_PARAM_locate_const
                       (in_stack_ffffffffffffffd0,
                        (char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    if (pOVar2 != (OSSL_PARAM *)0x0) {
      in_stack_ffffffffffffffd0 = (OSSL_PARAM *)((long)&in_RDI->data + 1);
      if ((pOVar2->data_size != *(size_t *)&in_RDI[2].data_type) ||
         (iVar1 = OSSL_PARAM_get_octet_string
                            (in_RDI,&pOVar2->key,(size_t)in_stack_ffffffffffffffd0,
                             (size_t *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8)
                            ), iVar1 == 0)) {
        return 0;
      }
      CRYPTO_clear_free(in_RDI,(size_t)pOVar2,(char *)in_stack_ffffffffffffffd0,
                        in_stack_ffffffffffffffcc);
      in_RDI[2].key = (char *)0x0;
      *(byte *)&in_RDI->data = *(byte *)&in_RDI->data & 0xfe | 1;
    }
    pOVar2 = OSSL_PARAM_locate_const
                       (in_stack_ffffffffffffffd0,
                        (char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    if ((pOVar2 == (OSSL_PARAM *)0x0) ||
       ((pOVar2->data_type == 4 &&
        (iVar1 = set_property_query((ECX_KEY *)
                                    CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                                    (char *)0x337148), iVar1 != 0)))) {
      local_4 = 1;
    }
    else {
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

static int ecx_set_params(void *key, const OSSL_PARAM params[])
{
    ECX_KEY *ecxkey = key;
    const OSSL_PARAM *p;

    if (params == NULL)
        return 1;

    p = OSSL_PARAM_locate_const(params, OSSL_PKEY_PARAM_ENCODED_PUBLIC_KEY);
    if (p != NULL) {
        void *buf = ecxkey->pubkey;

        if (p->data_size != ecxkey->keylen
                || !OSSL_PARAM_get_octet_string(p, &buf, sizeof(ecxkey->pubkey),
                                                NULL))
            return 0;
        OPENSSL_clear_free(ecxkey->privkey, ecxkey->keylen);
        ecxkey->privkey = NULL;
        ecxkey->haspubkey = 1;
    }
    p = OSSL_PARAM_locate_const(params, OSSL_PKEY_PARAM_PROPERTIES);
    if (p != NULL) {
        if (p->data_type != OSSL_PARAM_UTF8_STRING
            || !set_property_query(ecxkey, p->data))
            return 0;
    }

    return 1;
}